

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

ostream * jaegertracing::sampling_manager::thrift::operator<<(ostream *out,type *val)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  type local_24;
  _Self local_20;
  const_iterator it;
  type *val_local;
  ostream *out_local;
  
  local_24 = *val;
  it._M_node = (_Base_ptr)val;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
       ::find((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
               *)_SamplingStrategyType_VALUES_TO_NAMES,(key_type_conflict *)&local_24);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
       ::end((map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              *)_SamplingStrategyType_VALUES_TO_NAMES);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_char_*>_>::operator->
                       (&local_20);
    std::operator<<(out,ppVar2->second);
  }
  else {
    std::ostream::operator<<(out,(it._M_node)->_M_color);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const SamplingStrategyType::type& val) {
  std::map<int, const char*>::const_iterator it = _SamplingStrategyType_VALUES_TO_NAMES.find(val);
  if (it != _SamplingStrategyType_VALUES_TO_NAMES.end()) {
    out << it->second;
  } else {
    out << static_cast<int>(val);
  }
  return out;
}